

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O1

FT_Fixed FT_Vector_Length(FT_Vector *vec)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  undefined1 auVar4 [8];
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  undefined1 auStack_28 [8];
  FT_Vector v;
  
  if (vec == (FT_Vector *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar8 = vec->x;
    uVar2 = vec->y;
    if (uVar8 == 0) {
      uVar5 = -uVar2;
      if (0 < (long)uVar2) {
        uVar5 = uVar2;
      }
    }
    else {
      uVar5 = -uVar8;
      if (0 < (long)uVar8) {
        uVar5 = uVar8;
      }
      if (uVar2 != 0) {
        uVar7 = -uVar2;
        if (0 < (long)uVar2) {
          uVar7 = uVar2;
        }
        uVar3 = (uint)uVar5 | (uint)uVar7;
        uVar1 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
          }
        }
        if (uVar1 < 0x1e) {
          iVar9 = 0x1d - uVar1;
          auStack_28 = (undefined1  [8])(uVar8 << ((byte)iVar9 & 0x3f));
          v.x = uVar2 << ((byte)iVar9 & 0x3f);
        }
        else {
          iVar9 = (uVar1 ^ 0x1f) - 2;
          bVar6 = 2 - (char)(uVar1 ^ 0x1f);
          auStack_28 = (undefined1  [8])((long)uVar8 >> (bVar6 & 0x3f));
          v.x = (long)uVar2 >> (bVar6 & 0x3f);
        }
        ft_trig_pseudo_polarize((FT_Vector *)auStack_28);
        auVar4 = (undefined1  [8])-(long)auStack_28;
        if (0 < (long)auStack_28) {
          auVar4 = auStack_28;
        }
        uVar8 = (long)auVar4 * 0xdbd95b16 + 0x40000000U >> 0x20;
        uVar5 = -uVar8;
        if (-1 < (long)auStack_28) {
          uVar5 = uVar8;
        }
        bVar6 = (byte)iVar9;
        if (iVar9 < 1) {
          uVar5 = (ulong)(uint)((int)uVar5 << (-bVar6 & 0x1f));
        }
        else {
          uVar5 = (long)(uVar5 + (1L << (bVar6 - 1 & 0x3f))) >> (bVar6 & 0x3f);
        }
      }
    }
  }
  return uVar5;
}

Assistant:

FT_EXPORT_DEF( FT_Fixed )
  FT_Vector_Length( FT_Vector*  vec )
  {
    FT_Int     shift;
    FT_Vector  v;


    if ( !vec )
      return 0;

    v = *vec;

    /* handle trivial cases */
    if ( v.x == 0 )
    {
      return FT_ABS( v.y );
    }
    else if ( v.y == 0 )
    {
      return FT_ABS( v.x );
    }

    /* general case */
    shift = ft_trig_prenorm( &v );
    ft_trig_pseudo_polarize( &v );

    v.x = ft_trig_downscale( v.x );

    if ( shift > 0 )
      return ( v.x + ( 1L << ( shift - 1 ) ) ) >> shift;

    return (FT_Fixed)( (FT_UInt32)v.x << -shift );
  }